

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

wchar_t assertion_nodump(char *file,wchar_t line,char *pathname)

{
  msg = nextmsg;
  assertions = assertions + L'\x01';
  nextmsg = (char *)0x0;
  return L'\x01';
}

Assistant:

static void
assertion_count(const char *file, int line)
{
	(void)file; /* UNUSED */
	(void)line; /* UNUSED */
	++assertions;
	/* Proper handling of "failure()" message. */
	msg = nextmsg;
	nextmsg = NULL;
	/* Uncomment to print file:line after every assertion.
	 * Verbose, but occasionally useful in tracking down crashes. */
	/* printf("Checked %s:%d\n", file, line); */
}